

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PopFunctionBlockerBarrier(cmMakefile *this,bool reportError)

{
  pointer *ppuVar1;
  ulong uVar2;
  pointer ppcVar3;
  cmFunctionBlocker *pcVar4;
  ostream *poVar5;
  string sStack_1c8;
  ostringstream e;
  
  uVar2 = (this->FunctionBlockerBarriers).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  while (ppcVar3 = (this->FunctionBlockers).
                   super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
        uVar2 < (ulong)((long)ppcVar3 -
                        (long)(this->FunctionBlockers).
                              super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    pcVar4 = ppcVar3[-1];
    (this->FunctionBlockers).
    super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar3 + -1;
    if ((reportError & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,"A logical block opening on the line\n");
      poVar5 = std::operator<<(poVar5,"  ");
      poVar5 = ::operator<<(poVar5,&pcVar4->StartingContext);
      poVar5 = std::operator<<(poVar5,"\n");
      std::operator<<(poVar5,"is not closed.");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&sStack_1c8);
      std::__cxx11::string::~string((string *)&sStack_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    reportError = false;
    if (pcVar4 != (cmFunctionBlocker *)0x0) {
      (*pcVar4->_vptr_cmFunctionBlocker[3])(pcVar4);
      reportError = false;
    }
  }
  ppuVar1 = &(this->FunctionBlockerBarriers).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  return;
}

Assistant:

void cmMakefile::PopFunctionBlockerBarrier(bool reportError)
{
  // Remove any extra entries pushed on the barrier.
  FunctionBlockersType::size_type barrier =
    this->FunctionBlockerBarriers.back();
  while (this->FunctionBlockers.size() > barrier) {
    std::unique_ptr<cmFunctionBlocker> fb(this->FunctionBlockers.back());
    this->FunctionBlockers.pop_back();
    if (reportError) {
      // Report the context in which the unclosed block was opened.
      cmListFileContext const& lfc = fb->GetStartingContext();
      std::ostringstream e;
      /* clang-format off */
      e << "A logical block opening on the line\n"
        << "  " << lfc << "\n"
        << "is not closed.";
      /* clang-format on */
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      reportError = false;
    }
  }

  // Remove the barrier.
  this->FunctionBlockerBarriers.pop_back();
}